

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccf507::SumSquares1DTest_RandomValues_Test::TestBody
          (SumSquares1DTest_RandomValues_Test *this)

{
  uint uVar1;
  ACMRandom *this_00;
  undefined8 *puVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  int i;
  long lVar6;
  SEARCH_METHODS *message;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  AssertHelper AStack_20078;
  Message MStack_20070;
  RegisterStateCheckMMX reg_check_mmx;
  uint64_t tst_res;
  uint64_t ref_res;
  int16_t src [65536];
  
  this_00 = &(this->super_SumSquares1DTest).
             super_FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)>.rng_;
  iVar5 = 0;
  while( true ) {
    if (iVar5 == 1000) {
      return;
    }
    bVar3 = testing::Test::HasFatalFailure();
    if (bVar3) break;
    for (lVar6 = 0; lVar6 != 0x10000; lVar6 = lVar6 + 1) {
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x1fff);
      src[lVar6] = (short)uVar4 + -0xfff;
    }
    uVar4 = testing::internal::Random::Generate(&this_00->random_,0xff);
    uVar1 = uVar4 * 0x40 + 0x40;
    ref_res = (*(this->super_SumSquares1DTest).
                super_FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)>.
                params_.ref_func)(src,uVar1);
    reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord;
    reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
    tst_res = (*(this->super_SumSquares1DTest).
                super_FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)>.
                params_.tst_func)(src,uVar1);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&reg_check_mmx,"ref_res","tst_res",&ref_res,&tst_res);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message(&MStack_20070);
      puVar2 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar2 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (SEARCH_METHODS *)*puVar2;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_20078,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
                 ,0xda,(char *)message);
      testing::internal::AssertHelper::operator=(&AStack_20078,&MStack_20070);
      testing::internal::AssertHelper::~AssertHelper(&AStack_20078);
      if (MStack_20070.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)MStack_20070.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
      return;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

TEST_P(SumSquares1DTest, RandomValues) {
  DECLARE_ALIGNED(16, int16_t, src[kMaxSize * kMaxSize]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    for (int i = 0; i < kMaxSize * kMaxSize; ++i)
      src[i] = rng_(kInt13Max * 2 + 1) - kInt13Max;

    // Block size is between 64 and 128 * 128 and is always a multiple of 64.
    const int n = (rng_(255) + 1) * 64;

    const uint64_t ref_res = params_.ref_func(src, n);
    uint64_t tst_res;
    API_REGISTER_STATE_CHECK(tst_res = params_.tst_func(src, n));

    ASSERT_EQ(ref_res, tst_res);
  }
}